

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O2

void nvrm_munmap(uint32_t id,uint64_t mmap_addr,uint64_t len,uint64_t mmap_offset)

{
  gpu_object *pgVar1;
  cpu_mapping *cpu_mapping;
  gpu_object **ppgVar2;
  cpu_mapping **ppcVar3;
  
  ppgVar2 = &gpu_objects;
  do {
    pgVar1 = *ppgVar2;
    if (pgVar1 == (gpu_object *)0x0) {
      if (dump_sys_munmap != 0) {
        fputc(10,_stdout);
        if (mmt_sync_fd != -1) {
          fflush(_stdout);
        }
      }
      buffer_munmap(id);
      return;
    }
    ppcVar3 = &pgVar1->cpu_mappings;
    while (cpu_mapping = *ppcVar3, cpu_mapping != (cpu_mapping *)0x0) {
      if (cpu_mapping->cpu_addr == mmap_addr) {
        if ((dump_sys_munmap != 0) && (cpu_mapping->fdtype == FDNVIDIA)) {
          fprintf(_stdout,", cid: 0x%08x, handle: 0x%08x",(ulong)pgVar1->cid,(ulong)pgVar1->handle);
          describe_nvrm_object(pgVar1->cid,pgVar1->handle,"");
        }
        disconnect_cpu_mapping_from_gpu_object(cpu_mapping);
        break;
      }
      ppcVar3 = &cpu_mapping->next;
    }
    ppgVar2 = &pgVar1->next;
  } while( true );
}

Assistant:

void nvrm_munmap(uint32_t id, uint64_t mmap_addr, uint64_t len, uint64_t mmap_offset)
{
	struct gpu_object *obj;
	struct cpu_mapping *cpu_mapping;

	for (obj = gpu_objects; obj != NULL; obj = obj->next)
		for (cpu_mapping = obj->cpu_mappings; cpu_mapping != NULL; cpu_mapping = cpu_mapping->next)
			if (cpu_mapping->cpu_addr == mmap_addr)
			{
				if (dump_sys_munmap)
				{
					if (cpu_mapping->fdtype == FDNVIDIA)
					{
						mmt_log_cont(", cid: 0x%08x, handle: 0x%08x", obj->cid, obj->handle);
						describe_nvrm_object(obj->cid, obj->handle, "");
					}
				}

				disconnect_cpu_mapping_from_gpu_object(cpu_mapping);
				break;
			}

	if (dump_sys_munmap)
		mmt_log_cont_nl();

	buffer_munmap(id);
}